

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O1

void __thiscall Output_Port::Destroy(Output_Port *this,Am_Constraint *self)

{
  bool bVar1;
  Am_Constraint *pAVar2;
  Am_Constraint_Tag constraint_tag;
  Am_Slot slot;
  Am_Constraint_Iterator iter;
  Am_Slot local_30;
  Am_Constraint_Iterator local_28;
  
  local_30.data = (this->context).data;
  (this->context).data = (Am_Slot_Data *)0x0;
  if (this->next != (Output_Port *)0x0) {
    Destroy(this->next,self);
    this->next = (Output_Port *)0x0;
  }
  Am_Constraint_Iterator::Am_Constraint_Iterator(&local_28,&local_30);
  Am_Constraint_Iterator::Start(&local_28);
  bVar1 = Am_Constraint_Iterator::Last(&local_28);
  if (!bVar1) {
    do {
      pAVar2 = Am_Constraint_Iterator::Get(&local_28);
      if (pAVar2 == self) {
        constraint_tag = Am_Constraint_Iterator::Get_Tag(&local_28);
        Am_Slot::Remove_Constraint(&local_30,constraint_tag);
        break;
      }
      Am_Constraint_Iterator::Next(&local_28);
      bVar1 = Am_Constraint_Iterator::Last(&local_28);
    } while (!bVar1);
  }
  Dyn_Memory_Manager::Delete(&memory,this);
  return;
}

Assistant:

void Destroy(Am_Constraint *self)
  {
    Am_Slot slot = context;
    context = (Am_Slot_Data *)nullptr;
    if (next) {
      next->Destroy(self);
      next = nullptr;
    }
    Am_Constraint_Iterator iter(slot);
    Am_Constraint *curr;
    for (iter.Start(); !iter.Last(); iter.Next()) {
      curr = iter.Get();
      if (curr == self) {
        Am_Constraint_Tag tag = iter.Get_Tag();
        slot.Remove_Constraint(tag);
        break;
      }
    }
    delete this;
  }